

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_AggregateComponentStatusEx *
ON_Internal_AggregateComponentStatusEx_Init
          (ON_AggregateComponentStatusEx *__return_storage_ptr__,int k)

{
  ON_AggregateComponentStatus s;
  ON_AggregateComponentStatus local_28;
  
  local_28.m_highlighted_count = 0;
  local_28.m_hidden_count = 0;
  local_28.m_locked_count = 0;
  local_28.m_damaged_count = 0;
  local_28.m_aggregate_status.m_status_flags = '\0';
  local_28.m_aggregate_status.m_mark_bits = '\0';
  local_28.m_current = '\0';
  local_28.m_reserved1 = '\0';
  local_28.m_component_count = 0;
  local_28.m_selected_count = 0;
  local_28.m_selected_persistent_count = 0;
  if (k == 1) {
    ON_AggregateComponentStatus::MarkAsNotCurrent(&local_28);
  }
  ON_AggregateComponentStatusEx::ON_AggregateComponentStatusEx(__return_storage_ptr__,&local_28);
  __return_storage_ptr__->m_component_status_serial_number = 0;
  return __return_storage_ptr__;
}

Assistant:

static ON_AggregateComponentStatusEx ON_Internal_AggregateComponentStatusEx_Init(int k)
{
  ON_AggregateComponentStatusEx s(ON_Internal_AggregateComponentStatus_Init(k));
  *((ON__UINT64*)(((char*)(&s)) + sizeof(ON_AggregateComponentStatus))) = 0; // m_component_status_serial_number = 0 
  return s;
}